

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int ReadHuffmanCode(int alphabet_size,VP8LDecoder *dec,int *code_lengths,HuffmanCode *table)

{
  VP8LBitReader *br;
  byte bVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  uint local_2a4;
  int code_length_code_lengths [19];
  HuffmanCode local_238 [130];
  
  br = &dec->br_;
  uVar3 = VP8LReadBits(br,1);
  memset(code_lengths,0,(long)alphabet_size << 2);
  if (uVar3 == 0) {
    code_length_code_lengths[0x10] = 0;
    code_length_code_lengths[0x11] = 0;
    code_length_code_lengths[0x12] = 0;
    code_length_code_lengths[0xc] = 0;
    code_length_code_lengths[0xd] = 0;
    code_length_code_lengths[0xe] = 0;
    code_length_code_lengths[0xf] = 0;
    code_length_code_lengths[8] = 0;
    code_length_code_lengths[9] = 0;
    code_length_code_lengths[10] = 0;
    code_length_code_lengths[0xb] = 0;
    code_length_code_lengths[4] = 0;
    code_length_code_lengths[5] = 0;
    code_length_code_lengths[6] = 0;
    code_length_code_lengths[7] = 0;
    code_length_code_lengths[0] = 0;
    code_length_code_lengths[1] = 0;
    code_length_code_lengths[2] = 0;
    code_length_code_lengths[3] = 0;
    uVar3 = VP8LReadBits(br,4);
    uVar9 = uVar3 + 4;
    if (0x13 < (int)uVar9) goto LAB_0010ca74;
    uVar11 = 0;
    uVar10 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar10 = uVar11;
    }
    for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      uVar3 = VP8LReadBits(br,3);
      code_length_code_lengths["\x11\x12"[uVar11]] = uVar3;
    }
    iVar5 = VP8LBuildHuffmanTable(local_238,7,code_length_code_lengths,0x13);
    if (iVar5 == 0) goto LAB_0010ca74;
    uVar3 = VP8LReadBits(br,1);
    iVar5 = alphabet_size;
    if (uVar3 != 0) {
      uVar3 = VP8LReadBits(br,3);
      uVar3 = VP8LReadBits(br,uVar3 * 2 + 2);
      iVar5 = uVar3 + 2;
      if (alphabet_size < iVar5) goto LAB_0010ca74;
    }
    iVar12 = 0;
    local_2a4 = 8;
    while ((iVar12 < alphabet_size && (bVar13 = iVar5 != 0, iVar5 = iVar5 + -1, bVar13))) {
      VP8LFillBitWindow(br);
      iVar6 = (dec->br_).bit_pos_;
      uVar9 = (uint)((dec->br_).val_ >> ((byte)iVar6 & 0x3f)) & 0x7f;
      (dec->br_).bit_pos_ = (uint)local_238[uVar9].bits + iVar6;
      uVar2 = local_238[uVar9].value;
      uVar9 = (uint)uVar2;
      if (uVar2 < 0x10) {
        iVar6 = iVar12 + 1;
        code_lengths[iVar12] = (uint)uVar2;
        iVar12 = iVar6;
        if (uVar9 != 0) {
          local_2a4 = uVar9;
        }
      }
      else {
        bVar1 = "\x03\x03\v"[uVar2 - 0x10];
        uVar3 = VP8LReadBits(br,(uint)"\x02\x03\a"[uVar2 - 0x10]);
        iVar6 = uVar3 + bVar1;
        if (alphabet_size < iVar6 + iVar12) goto LAB_0010ca74;
        uVar7 = 0;
        if (uVar9 == 0x10) {
          uVar7 = local_2a4;
        }
        puVar8 = (uint *)(code_lengths + iVar12);
        for (; 0 < iVar6; iVar6 = iVar6 + -1) {
          *puVar8 = uVar7;
          iVar12 = iVar12 + 1;
          puVar8 = puVar8 + 1;
        }
      }
    }
  }
  else {
    uVar3 = VP8LReadBits(br,1);
    uVar4 = VP8LReadBits(br,1);
    iVar5 = 8;
    if (uVar4 == 0) {
      iVar5 = 1;
    }
    uVar4 = VP8LReadBits(br,iVar5);
    code_lengths[(int)uVar4] = 1;
    if (uVar3 == 1) {
      uVar3 = VP8LReadBits(br,8);
      code_lengths[(int)uVar3] = 1;
    }
  }
  if (((dec->br_).eos_ == 0) &&
     (iVar5 = VP8LBuildHuffmanTable(table,8,code_lengths,alphabet_size), iVar5 != 0)) {
    return iVar5;
  }
LAB_0010ca74:
  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  return 0;
}

Assistant:

static int ReadHuffmanCode(int alphabet_size, VP8LDecoder* const dec,
                           int* const code_lengths, HuffmanCode* const table) {
  int ok = 0;
  int size = 0;
  VP8LBitReader* const br = &dec->br_;
  const int simple_code = VP8LReadBits(br, 1);

  memset(code_lengths, 0, alphabet_size * sizeof(*code_lengths));

  if (simple_code) {  // Read symbols, codes & code lengths directly.
    const int num_symbols = VP8LReadBits(br, 1) + 1;
    const int first_symbol_len_code = VP8LReadBits(br, 1);
    // The first code is either 1 bit or 8 bit code.
    int symbol = VP8LReadBits(br, (first_symbol_len_code == 0) ? 1 : 8);
    code_lengths[symbol] = 1;
    // The second code (if present), is always 8 bit long.
    if (num_symbols == 2) {
      symbol = VP8LReadBits(br, 8);
      code_lengths[symbol] = 1;
    }
    ok = 1;
  } else {  // Decode Huffman-coded code lengths.
    int i;
    int code_length_code_lengths[NUM_CODE_LENGTH_CODES] = { 0 };
    const int num_codes = VP8LReadBits(br, 4) + 4;
    if (num_codes > NUM_CODE_LENGTH_CODES) {
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      return 0;
    }

    for (i = 0; i < num_codes; ++i) {
      code_length_code_lengths[kCodeLengthCodeOrder[i]] = VP8LReadBits(br, 3);
    }
    ok = ReadHuffmanCodeLengths(dec, code_length_code_lengths, alphabet_size,
                                code_lengths);
  }

  ok = ok && !br->eos_;
  if (ok) {
    size = VP8LBuildHuffmanTable(table, HUFFMAN_TABLE_BITS,
                                 code_lengths, alphabet_size);
  }
  if (!ok || size == 0) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    return 0;
  }
  return size;
}